

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar7;
  MessageGenerator *this_00;
  pointer ppMVar8;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar9;
  EnumGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *psVar10;
  ServiceGenerator *this_02;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar11;
  ExtensionGenerator *this_03;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this->file_ = file;
  (this->options_).dllexport_decl._M_dataplus._M_p =
       (pointer)&(this->options_).dllexport_decl.field_2;
  pcVar2 = (options->dllexport_decl)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->options_,pcVar2,pcVar2 + (options->dllexport_decl)._M_string_length);
  bVar3 = options->table_driven_parsing;
  (this->options_).enforce_lite = options->enforce_lite;
  (this->options_).table_driven_parsing = bVar3;
  bVar3 = options->proto_h;
  bVar4 = options->transitive_pb_h;
  bVar5 = options->annotate_headers;
  (this->options_).safe_boundary_check = options->safe_boundary_check;
  (this->options_).proto_h = bVar3;
  (this->options_).transitive_pb_h = bVar4;
  (this->options_).annotate_headers = bVar5;
  (this->options_).annotation_pragma_name._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_pragma_name.field_2;
  pcVar2 = (options->annotation_pragma_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_pragma_name,pcVar2,
             pcVar2 + (options->annotation_pragma_name)._M_string_length);
  (this->options_).annotation_guard_name._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_guard_name.field_2;
  pcVar2 = (options->annotation_guard_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_guard_name,pcVar2,
             pcVar2 + (options->annotation_guard_name)._M_string_length);
  SCCAnalyzer::SCCAnalyzer(&this->scc_analyzer_,options);
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = *(int *)(file + 0x58);
  lVar14 = (long)iVar1;
  uVar12 = lVar14 * 8;
  uVar13 = uVar12 + 8;
  if (0xfffffffffffffff7 < uVar12) {
    uVar13 = 0xffffffffffffffff;
  }
  if (lVar14 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  plVar6 = (long *)operator_new__(uVar13);
  *plVar6 = lVar14;
  if (iVar1 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(plVar6 + 1),0,uVar12);
  }
  (this->message_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(plVar6 + 1);
  iVar1 = *(int *)(file + 0x68);
  lVar14 = (long)iVar1;
  uVar12 = lVar14 * 8;
  uVar13 = uVar12 + 8;
  if (0xfffffffffffffff7 < uVar12) {
    uVar13 = 0xffffffffffffffff;
  }
  if (lVar14 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  plVar6 = (long *)operator_new__(uVar13);
  *plVar6 = lVar14;
  if (iVar1 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar6 + 1),0,uVar12);
  }
  (this->enum_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar6 + 1);
  iVar1 = *(int *)(file + 0x78);
  lVar14 = (long)iVar1;
  uVar12 = lVar14 * 8;
  uVar13 = uVar12 + 8;
  if (0xfffffffffffffff7 < uVar12) {
    uVar13 = 0xffffffffffffffff;
  }
  if (lVar14 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  plVar6 = (long *)operator_new__(uVar13);
  *plVar6 = lVar14;
  if (iVar1 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(plVar6 + 1),0,uVar12);
  }
  (this->service_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(plVar6 + 1);
  iVar1 = *(int *)(file + 0x88);
  lVar14 = (long)iVar1;
  uVar12 = lVar14 * 8;
  uVar13 = uVar12 + 8;
  if (0xfffffffffffffff7 < uVar12) {
    uVar13 = 0xffffffffffffffff;
  }
  if (lVar14 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  plVar6 = (long *)operator_new__(uVar13);
  *plVar6 = lVar14;
  if (iVar1 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar6 + 1),0,uVar12)
    ;
  }
  (this->extension_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar6 + 1);
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < *(int *)(file + 0x58)) {
    lVar15 = 0;
    lVar14 = 0;
    do {
      psVar7 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->message_generators_owner_,lVar14);
      this_00 = (MessageGenerator *)operator_new(0x118);
      MessageGenerator::MessageGenerator
                (this_00,(Descriptor *)(*(long *)(file + 0x60) + lVar15),options,
                 &this->scc_analyzer_);
      internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::reset(psVar7,this_00)
      ;
      psVar7 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->message_generators_owner_,lVar14);
      if (psVar7->ptr_ == (MessageGenerator *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
                     );
      }
      MessageGenerator::Flatten(psVar7->ptr_,&this->message_generators_);
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xa8;
    } while (lVar14 < *(int *)(file + 0x58));
    ppMVar8 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->message_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppMVar8) {
      uVar12 = 0;
      do {
        MessageGenerator::AddGenerators
                  (ppMVar8[uVar12],&this->enum_generators_,&this->extension_generators_);
        uVar12 = uVar12 + 1;
        ppMVar8 = (this->message_generators_).
                  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)((long)(this->message_generators_).
                                      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar8 >>
                               3));
    }
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar15 = 0;
    lVar14 = 0;
    do {
      psVar9 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](&this->enum_generators_owner_,lVar14);
      this_01 = (EnumGenerator *)operator_new(0x38);
      EnumGenerator::EnumGenerator
                (this_01,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar15),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::reset(psVar9,this_01);
      psVar9 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](&this->enum_generators_owner_,lVar14);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar9->ptr_;
      std::
      vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
      ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator*>
                ((vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
                  *)&this->enum_generators_,(EnumGenerator **)&local_68);
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x38;
    } while (lVar14 < *(int *)(file + 0x68));
  }
  if (0 < *(int *)(file + 0x78)) {
    lVar15 = 0;
    lVar14 = 0;
    do {
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
                ::operator[](&this->service_generators_owner_,lVar14);
      this_02 = (ServiceGenerator *)operator_new(0x40);
      ServiceGenerator::ServiceGenerator
                (this_02,(ServiceDescriptor *)(*(long *)(file + 0x80) + lVar15),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::reset
                (psVar10,this_02);
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
                ::operator[](&this->service_generators_owner_,lVar14);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar10->ptr_;
      std::
      vector<google::protobuf::compiler::cpp::ServiceGenerator*,std::allocator<google::protobuf::compiler::cpp::ServiceGenerator*>>
      ::emplace_back<google::protobuf::compiler::cpp::ServiceGenerator*>
                ((vector<google::protobuf::compiler::cpp::ServiceGenerator*,std::allocator<google::protobuf::compiler::cpp::ServiceGenerator*>>
                  *)&this->service_generators_,(ServiceGenerator **)&local_68);
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x30;
    } while (lVar14 < *(int *)(file + 0x78));
  }
  if (0 < *(int *)(file + 0x88)) {
    lVar15 = 0;
    lVar14 = 0;
    do {
      psVar11 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_owner_,lVar14);
      this_03 = (ExtensionGenerator *)operator_new(0x90);
      ExtensionGenerator::ExtensionGenerator
                (this_03,(FieldDescriptor *)(*(long *)(file + 0x98) + lVar15),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::reset
                (psVar11,this_03);
      psVar11 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_owner_,lVar14);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar11->ptr_;
      std::
      vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
      ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator*>
                ((vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
                  *)&this->extension_generators_,(ExtensionGenerator **)&local_68);
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xa8;
    } while (lVar14 < *(int *)(file + 0x88));
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SplitStringUsing(*(string **)(this->file_ + 8),".",&local_48);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->package_parts_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->package_parts_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->package_parts_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options)
    : file_(file),
      options_(options),
      scc_analyzer_(options),
      message_generators_owner_(
          new google::protobuf::scoped_ptr<MessageGenerator>[file->message_type_count()]),
      enum_generators_owner_(
          new google::protobuf::scoped_ptr<EnumGenerator>[file->enum_type_count()]),
      service_generators_owner_(
          new google::protobuf::scoped_ptr<ServiceGenerator>[file->service_count()]),
      extension_generators_owner_(
          new google::protobuf::scoped_ptr<ExtensionGenerator>[file->extension_count()]) {

  for (int i = 0; i < file->message_type_count(); i++) {
    message_generators_owner_[i].reset(
        new MessageGenerator(file->message_type(i), options, &scc_analyzer_));
    message_generators_owner_[i]->Flatten(&message_generators_);
  }

  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->AddGenerators(&enum_generators_,
                                          &extension_generators_);
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_owner_[i].reset(
        new EnumGenerator(file->enum_type(i), options));
    enum_generators_.push_back(enum_generators_owner_[i].get());
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_owner_[i].reset(
        new ServiceGenerator(file->service(i), options));
    service_generators_.push_back(service_generators_owner_[i].get());
  }

  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_owner_[i].reset(
        new ExtensionGenerator(file->extension(i), options));
    extension_generators_.push_back(extension_generators_owner_[i].get());
  }

  package_parts_ = Split(file_->package(), ".", true);
}